

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int luaL_typerror(lua_State *L,int narg,char *tname)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = lua_type(L,narg);
  if (iVar1 == -1) {
    pcVar2 = "no value";
  }
  else {
    pcVar2 = luaT_typenames[iVar1];
  }
  pcVar2 = lua_pushfstring(L,"%s expected, got %s",tname,pcVar2);
  luaL_argerror(L,narg,pcVar2);
}

Assistant:

static int luaL_typerror(lua_State*L,int narg,const char*tname){
const char*msg=lua_pushfstring(L,"%s expected, got %s",
tname,luaL_typename(L,narg));
return luaL_argerror(L,narg,msg);
}